

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O0

string * parse_host<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                   (string *__return_storage_ptr__,
                   request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                   *request)

{
  string local_70 [32];
  long local_50;
  size_t pos;
  allocator<char> local_31;
  string_view local_30;
  undefined1 local_19;
  request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
  *local_18;
  request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
  *request_local;
  string *host;
  
  local_19 = 0;
  local_18 = request;
  request_local =
       (request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
        *)__return_storage_ptr__;
  local_30 = boost::beast::http::basic_fields<std::allocator<char>_>::at
                       ((basic_fields<std::allocator<char>_> *)request,host);
  std::allocator<char>::allocator();
  boost::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
            (__return_storage_ptr__,(basic_string_view<char,std::char_traits<char>> *)&local_30,
             &local_31);
  std::allocator<char>::~allocator(&local_31);
  local_50 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1bfcd5);
  if (local_50 != -1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_70);
    std::__cxx11::string::~string(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parse_host(const http::request<Body, http::basic_fields<Allocator>>& request) {
    std::string host = request.at(http::field::host).to_string();
    size_t pos = host.find(":");
    if (pos != std::string::npos) {
        host = host.substr(0, pos);
    }

    return host;
}